

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtVector3>::resize
          (cbtAlignedObjectArray<cbtVector3> *this,int newsize,cbtVector3 *fillData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  cbtVector3 *pcVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = this->m_size;
  if (iVar3 <= newsize) {
    if ((iVar3 < newsize) && (this->m_capacity < newsize)) {
      if (newsize == 0) {
        pcVar6 = (cbtVector3 *)0x0;
      }
      else {
        pcVar6 = (cbtVector3 *)cbtAlignedAllocInternal((long)newsize << 4,0x10);
      }
      iVar4 = this->m_size;
      if (0 < (long)iVar4) {
        lVar7 = 0;
        do {
          puVar1 = (undefined8 *)((long)this->m_data->m_floats + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar6->m_floats + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar7 = lVar7 + 0x10;
        } while ((long)iVar4 * 0x10 != lVar7);
      }
      if (this->m_data != (cbtVector3 *)0x0) {
        if (this->m_ownsMemory == true) {
          cbtAlignedFreeInternal(this->m_data);
        }
        this->m_data = (cbtVector3 *)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = pcVar6;
      this->m_capacity = newsize;
    }
    if (iVar3 < newsize) {
      lVar7 = (long)newsize - (long)iVar3;
      lVar8 = (long)iVar3 << 4;
      do {
        uVar5 = *(undefined8 *)(fillData->m_floats + 2);
        puVar1 = (undefined8 *)((long)this->m_data->m_floats + lVar8);
        *puVar1 = *(undefined8 *)fillData->m_floats;
        puVar1[1] = uVar5;
        lVar8 = lVar8 + 0x10;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}